

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  char *__s1;
  float fVar2;
  float fVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  istream *piVar9;
  long lVar10;
  Point2f PVar11;
  Point2f PVar12;
  double (*padVar13) [3];
  long lVar14;
  long lVar15;
  queue<std::tuple<cv::Mat,_int,_double>,_std::deque<std::tuple<cv::Mat,_int,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double>_>_>_>
  *this;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  bool perspectiveCorrection;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  thread thread1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  thread thread2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  Point2f local_468;
  undefined8 uStack_460;
  string calibrationFile;
  string templateFile;
  Point2f inputPoints [4];
  thread thread3;
  string answer;
  float local_368;
  float fStack_364;
  VideoCapture capture;
  String transform;
  tuple<cv::Mat,_int,_double> frameInfo;
  Mat originalFrame;
  int *local_50;
  
  std::__cxx11::string::string((string *)&calibrationFile,"calibration.txt",(allocator *)&frameInfo)
  ;
  std::__cxx11::string::string((string *)&templateFile,"template.png",(allocator *)&frameInfo);
  if (2 < argc) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Too many arguments");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Execute with option \'-h\' or \'-help\' (without quotes) to see all the possible configuration"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_00105328:
    iVar6 = 1;
LAB_00105668:
    exit(iVar6);
  }
  if (argc != 2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Execute with option \'-h\' or \'-help\' (without quotes) to see all the possible arguments"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar4 = fileExist(&templateFile);
    if (bVar4) {
      cv::imread((string *)&frameInfo,(int)&templateFile);
      cv::Mat::operator=((Mat *)templ,(Mat *)&frameInfo);
      cv::Mat::~Mat((Mat *)&frameInfo);
      cv::VideoCapture::VideoCapture(&capture,0,0);
      cv::VideoCapture::set((int)&capture,9.0);
      cv::Mat::Mat(&originalFrame);
      frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.super__Head_base<0UL,_cv::Mat,_false>.
      _M_head_impl = (Mat)0x0;
      frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.super__Head_base<0UL,_cv::Mat,_false>.
      _1_7_ = 0;
      frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
      super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>._M_head_impl._0_4_ =
           0x2010000;
      frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
      _8_8_ = &originalFrame;
      cv::VideoCapture::read((_OutputArray *)&capture);
      cv::Mat::zeros((int)&frameInfo,*local_50,local_50[1]);
      (**(code **)(*(long *)CONCAT44(frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                                     super__Tuple_impl<1UL,_int,_double>.
                                     super__Tuple_impl<2UL,_double>.
                                     super__Head_base<2UL,_double,_false>._M_head_impl._4_4_,
                                     frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                                     super__Tuple_impl<1UL,_int,_double>.
                                     super__Tuple_impl<2UL,_double>.
                                     super__Head_base<2UL,_double,_false>._M_head_impl._0_4_) + 0x18
                  ))((long *)CONCAT44(frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                                      super__Tuple_impl<1UL,_int,_double>.
                                      super__Tuple_impl<2UL,_double>.
                                      super__Head_base<2UL,_double,_false>._M_head_impl._4_4_,
                                      frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                                      super__Tuple_impl<1UL,_int,_double>.
                                      super__Tuple_impl<2UL,_double>.
                                      super__Head_base<2UL,_double,_false>._M_head_impl._0_4_),
                     &frameInfo,plot_image,0xffffffffffffffff);
      cv::MatExpr::~MatExpr((MatExpr *)&frameInfo);
      answer._M_dataplus._M_p = (pointer)&answer.field_2;
      answer._M_string_length = 0;
      answer.field_2._M_local_buf[0] = '\0';
      do {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Do you want the program to apply perspective correction? [y/n]");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&answer);
        bVar4 = std::operator!=(&answer,"y");
        if (!bVar4) break;
        bVar4 = std::operator!=(&answer,"n");
      } while (bVar4);
      perspectiveCorrection = false;
      bVar4 = std::operator==(&answer,"y");
      if (bVar4) {
        perspectiveCorrection = true;
        inputPoints[2].x = 0.0;
        inputPoints[2].y = 0.0;
        inputPoints[3].x = 0.0;
        inputPoints[3].y = 0.0;
        inputPoints[0].x = 0.0;
        inputPoints[0].y = 0.0;
        inputPoints[1].x = 0.0;
        inputPoints[1].y = 0.0;
        bVar4 = fileExist(&calibrationFile);
        if (!bVar4) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Configuration file ");
          poVar8 = std::operator<<(poVar8,(string *)&calibrationFile);
          poVar8 = std::operator<<(poVar8," not found");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::operator<<((ostream *)&std::cerr,"\nPlease, retry calibration process");
          std::operator<<((ostream *)&std::cout,"Closing...");
          std::ostream::flush();
          iVar6 = -3;
          goto LAB_00105668;
        }
        std::fstream::fstream(&frameInfo,(string *)&calibrationFile,_S_out|_S_in);
        transform._M_dataplus._M_p = (pointer)&transform.field_2;
        transform._M_string_length = 0;
        uVar16 = 0;
        thread1._M_id._M_thread = (id)&aStack_498;
        transform.field_2._M_local_buf[0] = '\0';
        aStack_498._M_allocated_capacity._0_4_ = aStack_498._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        thread2._M_id._M_thread = (id)&local_478;
        local_478._M_local_buf[0] = '\0';
        while( true ) {
          piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&frameInfo,(string *)&transform);
          if ((((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) || (3 < uVar16))
          break;
          local_4b8 = uVar16;
          std::__cxx11::string::find((char *)&transform,0x10b222);
          std::__cxx11::string::substr((ulong)&thread3,(ulong)&transform);
          std::__cxx11::string::operator=((string *)&thread1,(string *)&thread3);
          std::__cxx11::string::~string((string *)&thread3);
          std::__cxx11::string::substr((ulong)&thread3,(ulong)&transform);
          std::__cxx11::string::operator=((string *)&thread2,(string *)&thread3);
          std::__cxx11::string::~string((string *)&thread3);
          iVar6 = std::__cxx11::stoi((string *)&thread1,(size_t *)0x0,10);
          iVar7 = std::__cxx11::stoi((string *)&thread2,(size_t *)0x0,10);
          PVar11.x = (float)iVar6;
          PVar11.y = (float)iVar7;
          inputPoints[local_4b8] = PVar11;
          uVar16 = local_4b8 + 1;
        }
        std::operator<<((ostream *)&std::cout,"Calibration file ok.");
        std::__cxx11::string::~string((string *)&thread2);
        std::__cxx11::string::~string((string *)&thread1);
        std::__cxx11::string::~string((string *)&transform);
        std::fstream::~fstream(&frameInfo);
        PVar11 = inputPoints[3];
        fVar3 = inputPoints[2].y;
        fVar2 = inputPoints[1].x;
        local_468 = inputPoints[0];
        uStack_460 = 0;
        local_4b8 = CONCAT44(inputPoints[2].x,inputPoints[1].y);
        uStack_4b0 = 0;
        std::__cxx11::string::string((string *)&transform,"New View",(allocator *)&frameInfo);
        local_368 = PVar11.x;
        fStack_364 = PVar11.y;
        thread1._M_id._M_thread = (id)0;
        uVar17 = -(uint)((int)ABS((float)local_4b8 - fStack_364) < (int)ABS(local_468.y - fVar3));
        uVar18 = -(uint)((int)ABS(local_4b8._4_4_ - local_368) < (int)ABS(local_468.x - fVar2));
        aStack_498._12_4_ =
             (undefined4)
             (int)(~uVar17 & (int)ABS((float)local_4b8 - fStack_364) |
                  (int)ABS(local_468.y - fVar3) & uVar17);
        aStack_498._4_8_ =
             CONCAT44((float)(int)(~uVar18 & (int)ABS(local_4b8._4_4_ - local_368) |
                                  (int)ABS(local_468.x - fVar2) & uVar18),aStack_498._12_4_);
        aStack_498._M_allocated_capacity._0_4_ = 0;
        cv::getPerspectiveTransform((Point_ *)&frameInfo,(Point_ *)inputPoints,(int)&thread1);
        lVar1 = *(long *)frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                         super__Head_base<0UL,_cv::Mat,_false>._56_8_;
        padVar13 = myMatrix;
        lVar10 = frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                 super__Head_base<0UL,_cv::Mat,_false>._0_8_;
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            (*padVar13)[lVar15] = *(double *)(lVar10 + lVar15 * 8);
          }
          lVar10 = lVar10 + lVar1;
          padVar13 = padVar13 + 1;
        }
        cv::Mat::~Mat((Mat *)&frameInfo);
        std::__cxx11::string::~string((string *)&transform);
      }
      std::thread::thread<void(&)(std::__cxx11::string_const&),char_const(&)[8],void>
                (&thread1,frameComputation,(char (*) [8])"threadA");
      std::thread::thread<void(&)(std::__cxx11::string_const&),char_const(&)[8],void>
                (&thread2,frameComputation,(char (*) [8])"threadB");
      std::thread::thread<void(&)(bool),bool&,void>(&thread3,writeFile,&perspectiveCorrection);
      std::thread::detach();
      std::thread::detach();
      std::thread::detach();
      PVar11 = (Point2f)std::chrono::_V2::system_clock::now();
      std::chrono::_V2::system_clock::now();
      std::tuple<cv::Mat,_int,_double>::tuple<void,_true>(&frameInfo);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)inputPoints);
      inputPoints[0].x = 0.0;
      inputPoints[0].y = 3.7480469;
      inputPoints[1].x = 0.0;
      inputPoints[1].y = 3.7480469;
      inputPoints[2].x = 0.0;
      inputPoints[2].y = 3.7480469;
      inputPoints[3].x = 0.0;
      inputPoints[3].y = 0.0;
      cv::Mat::operator=((Mat *)plot_image,(Scalar_ *)inputPoints);
      local_4b8 = local_4b8 & 0xffffffff00000000;
      bVar4 = false;
      while( true ) {
        inputPoints[2].x = 0.0;
        inputPoints[2].y = 0.0;
        inputPoints[0].x = 9.477423e-38;
        inputPoints[1].x = 1.562605e-39;
        inputPoints[1].y = 0.0;
        cv::VideoCapture::read((_OutputArray *)&capture);
        cVar5 = cv::Mat::empty();
        if (cVar5 != '\0') break;
        PVar12 = (Point2f)std::chrono::_V2::system_clock::now();
        if (!bVar4) {
          PVar11 = PVar12;
        }
        cv::Mat::clone();
        inputPoints[0] = (Point2f)((double)((long)PVar12 - (long)PVar11) / 1000000000.0);
        inputPoints[1].x = (float)local_4b8;
        local_468 = PVar11;
        cv::Mat::Mat((Mat *)(inputPoints + 2),(Mat *)&transform);
        std::_Tuple_impl<0ul,cv::Mat,int,double>::_M_assign<cv::Mat,int,double>
                  ((_Tuple_impl<0ul,cv::Mat,int,double> *)&frameInfo,
                   (_Tuple_impl<0UL,_cv::Mat,_int,_double> *)inputPoints);
        cv::Mat::~Mat((Mat *)(inputPoints + 2));
        cv::Mat::~Mat((Mat *)&transform);
        this = &frameQueue_B;
        if ((local_4b8 & 1) == 0) {
          this = &frameQueue_A;
        }
        std::
        deque<std::tuple<cv::Mat,_int,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double>_>_>
        ::push_back(&this->c,(value_type *)&frameInfo);
        local_4b8 = CONCAT44(local_4b8._4_4_,(int)(float)local_4b8 + 1);
        bVar4 = true;
        PVar11 = local_468;
      }
      std::operator<<((ostream *)&std::cerr,"ERROR! blank frame grabbed\n");
      cv::Mat::~Mat(&frameInfo.super__Tuple_impl<0UL,_cv::Mat,_int,_double>.
                     super__Head_base<0UL,_cv::Mat,_false>._M_head_impl);
      std::thread::~thread(&thread3);
      std::thread::~thread(&thread2);
      std::thread::~thread(&thread1);
      std::__cxx11::string::~string((string *)&answer);
      cv::Mat::~Mat(&originalFrame);
      cv::VideoCapture::~VideoCapture(&capture);
      std::__cxx11::string::~string((string *)&templateFile);
      std::__cxx11::string::~string((string *)&calibrationFile);
      return 0;
    }
    poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR. Can\'t find template file with name: ");
    poVar8 = std::operator<<(poVar8,(string *)&templateFile);
    poVar8 = std::operator<<(poVar8," \n Closing...");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::ostream::flush();
    iVar6 = -1;
    goto LAB_00105668;
  }
  __s1 = argv[1];
  cVar5 = *__s1;
  if (((cVar5 != '-') || (__s1[1] != 'h')) || (__s1[2] != '\0')) {
    iVar6 = strcmp(__s1,"-help");
    if (iVar6 != 0) {
      if (((cVar5 != '-') || (__s1[1] != 'g')) || (__s1[2] != '\0')) {
        iVar6 = strcmp(__s1,"-graph");
        if (iVar6 != 0) {
          if (((cVar5 != '-') || (__s1[1] != 'c')) || (__s1[2] != '\0')) {
            iVar6 = strcmp(__s1,"-calibrate");
            if (iVar6 != 0) {
              poVar8 = std::operator<<((ostream *)&std::cerr,__s1);
              poVar8 = std::operator<<(poVar8," is an unknown option");
              std::endl<char,std::char_traits<char>>(poVar8);
              goto LAB_00105328;
            }
          }
          calibrateCamera();
          goto LAB_0010539b;
        }
      }
      drawGraph();
      goto LAB_0010539b;
    }
  }
  puts("Program Options:");
  puts("Execute the program with none or one of the following arguments.");
  puts("-c  or  -calibrate\t\tTo calibrate the camera.");
  puts("-g  or  -graph          To display a 2D graph of coordinates from CSV file.");
  puts("-h  or  -help\t\t\tTo show this message.");
LAB_0010539b:
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {

    string calibrationFile = "calibration.txt";
    string templateFile = "template.png";

    if (argc > 2) {
        cerr << "Too many arguments" << endl;
        cout << "Execute with option '-h' or '-help' (without quotes) to see all the possible configuration" << endl;
        exit(1);
    }
    if (argc == 2) {
        if (strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "-help") == 0) {
            printf("Program Options:\n");
            printf("Execute the program with none or one of the following arguments.\n");
            printf("-c  or  -calibrate		To calibrate the camera.\n");
            printf("-g  or  -graph          To display a 2D graph of coordinates from CSV file.\n");
            printf("-h  or  -help			To show this message.\n");
            exit(0);
        }

        if (strcmp(argv[1], "-g") == 0 || strcmp(argv[1], "-graph") == 0) {
            drawGraph();
            exit(0);
        }

        if (strcmp(argv[1], "-c") == 0 || strcmp(argv[1], "-calibrate") == 0) {
            calibrateCamera();
            exit(0);
        }

        cerr << argv[1] << " is an unknown option" << endl;
        exit(1);
    }

    cout << "Execute with option '-h' or '-help' (without quotes) to see all the possible arguments" << endl;

    typedef std::chrono::high_resolution_clock Time;
    typedef std::chrono::duration<double> TimeCast;

    /// Load image and template

    if(fileExist(templateFile))
        templ = imread(templateFile, 1);
    else {
        cerr << "ERROR. Can't find template file with name: "<< templateFile<<" \n Closing..." << endl;
        cerr.flush();
        exit(-1);
    }

    ///If on Raspberry:
    // open the default camera
    VideoCapture capture(0);
    // setting fps rate of video to grab
    capture.set(CAP_PROP_FPS, int(9));

    ///If working locally:
    //VideoCapture capture("../videos/output.mp4");


    Mat originalFrame;
    capture.read(originalFrame);
    int frameWidth = originalFrame.size().width;
    int frameHeight = originalFrame.size().height;
    plot_image = Mat::zeros( frameHeight, frameWidth, CV_8UC3);



    ///ask if the user wants perspectiveCorrection
    string answer;
    do{
        cout<<"Do you want the program to apply perspective correction? [y/n]"<<endl;
        getline(cin,answer);
    }
    while(answer!="y" && answer!="n");

    bool perspectiveCorrection = false;
    if(answer=="y") {
        perspectiveCorrection = true;
        Point2f inputPoints[4];
        if(fileExist(calibrationFile)) {
            fstream file(calibrationFile);
            string textLine;
            int currentLine = 0;
            int posX, posY;
            string valX,valY;
            while (getline(file, textLine) && currentLine<4) {
                try {
                    int dotComma = textLine.find(";");
                    valX = textLine.substr(0, dotComma);
                    valY = textLine.substr(dotComma + 1, textLine.length());

                    posX = stoi(valX);
                    posY = stoi(valY);
                    inputPoints[currentLine] = Point(posX, posY);
                    currentLine++;

                } catch (...) {
                    cerr << "ERROR: something went wrong while parsing old points from "<<calibrationFile<<endl;
                    cerr<< " Wrong value: x "<<valX<<" Y "<<valY;
                    cerr << "\nPlease, retry calibration process";
                    cout<<"Closing...";
                    cerr.flush();
                    file.close();
                    exit(-2);
                }
            }
            cout<<"Calibration file ok.";

        }
        else{
            cerr<<"Configuration file "<<calibrationFile<<" not found"<<endl;
            cerr << "\nPlease, retry calibration process";
            cout<<"Closing...";
            cerr.flush();
            exit(-3);
        }

        Point p5 = Point(0, 0);
        int ABx = abs(inputPoints[0].x - inputPoints[1].x);
        int CDx =  abs(inputPoints[2].x - inputPoints[3].x);
        int perspectiveWidth = ABx < CDx ? CDx : ABx;
        int ACy = abs(inputPoints[0].y - inputPoints[2].y);
        int BDy =  abs(inputPoints[1].y - inputPoints[3].y);
        int perspectiveHeight = ACy < BDy ? BDy : ACy;

        Point p6 = Point(perspectiveWidth, 0);
        Point p7 = Point(0, perspectiveHeight);
        Point p8 = Point(perspectiveWidth, perspectiveHeight);
        String transform = "New View";

        Point2f outPoints[] = {p5, p6, p7, p8};
        Mat matrix = getPerspectiveTransform(inputPoints, outPoints);
        for (int i = 0; i < 3; i++)
            for (int j = 0; j < 3; j++)
                myMatrix[i][j] = matrix.at<double>(i, j);
    }

    /// starting the two threads that handle the frame computation here
    std::thread thread1 (frameComputation, "threadA");
    std::thread thread2 (frameComputation, "threadB");
    std::thread thread3 (writeFile,perspectiveCorrection);
    thread1.detach();
    thread2.detach();
    thread3.detach();

    auto startTime = Time::now();
    auto newTime = Time::now();
    TimeCast elapsed=newTime - startTime;
    bool start = false;
    std::tuple<Mat, int, double> frameInfo;
    int frame_number=0;



    /// initializing Mat of graph of movements
    plot_image = cv::Scalar(255, 255, 255);

    while(true) {

        /// wait for a new frame from camera and store it into 'frame'
        capture.read(frame);
        if (frame.empty()) {
            cerr << "ERROR! blank frame grabbed\n";
            break;
        }

        /// Getting the current timestamp to save it to the file
        newTime = Time::now();
        if(!start){
            startTime = newTime;
            start=true;
        }
        elapsed = newTime - startTime;

        /// preparing frame info to pass on the proper thread
        frameInfo = std::make_tuple(frame.clone(), frame_number, elapsed.count());

        /// equally distributing the work on the two queues
        if (frame_number % 2 ==0){
            frameQueue_A.push(frameInfo);
        }else{
            frameQueue_B.push(frameInfo);
        }

        frame_number++;

        // to print the status of the queues
        //if (frame_number % 100 ==0)
        //   cout<<frame_number<<" Elements in FrameA: "<<frameQueue_A.size()<<", elements in FrameB: "<<frameQueue_B.size()<<endl;

    }

    /// the camera will be de-initialized automatically in VideoCapture destructor
    return 0;
}